

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O1

string * str_first_non_empty(string *__return_storage_ptr__,
                            initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *l)

{
  pointer pcVar1;
  iterator pbVar2;
  long lVar3;
  size_type sVar4;
  bool bVar5;
  
  bVar5 = l->_M_len == 0;
  if (!bVar5) {
    pbVar2 = l->_M_array;
    sVar4 = pbVar2->_M_string_length;
    if (sVar4 == 0) {
      lVar3 = l->_M_len << 5;
      do {
        lVar3 = lVar3 + -0x20;
        bVar5 = lVar3 == 0;
        if (bVar5) goto LAB_001853f5;
        sVar4 = pbVar2[1]._M_string_length;
        pbVar2 = pbVar2 + 1;
      } while (sVar4 == 0);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar4);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
  }
LAB_001853f5:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string str_first_non_empty (const std::initializer_list<const std::string>& l)
{
    for (const std::string& s: l)
        if (!s.empty())
            return s;
    return "";
}